

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControl::setTextCursor
          (QWidgetTextControl *this,QTextCursor *cursor,bool selectionClipboard)

{
  QFlagsStorage<Qt::TextInteractionFlag> other;
  Int IVar1;
  Int IVar2;
  QWidgetTextControlPrivate *pQVar3;
  byte in_DL;
  QTextCursor *in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  bool posChanged;
  QWidgetTextControlPrivate *d;
  QTextCursor oldSelection;
  bool local_41;
  QFlagsStorage<Qt::TextInteractionFlag> in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar4;
  QWidgetTextControlPrivate *this_00;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QWidgetTextControl *)0x712db7);
  pQVar3->cursorIsFocusIndicator = false;
  other.i = QTextCursor::position();
  IVar1 = QTextCursor::position();
  uVar4 = CONCAT13(other.i != IVar1,(int3)in_stack_ffffffffffffffc4);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)&local_10,&pQVar3->cursor);
  QTextCursor::operator=(&pQVar3->cursor,in_RSI);
  local_41 = false;
  if ((pQVar3->hasFocus & 1U) != 0) {
    in_stack_ffffffffffffffc0.i =
         (Int)Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
    local_14.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
         (QFlagsStorage<Qt::TextInteractionFlag>)
         QFlags<Qt::TextInteractionFlag>::operator&
                   ((QFlags<Qt::TextInteractionFlag> *)in_RDI,
                    (QFlags<Qt::TextInteractionFlag>)other.i);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    local_41 = IVar2 != 0;
  }
  pQVar3->cursorOn = local_41;
  QWidgetTextControlPrivate::_q_updateCurrentCharFormatAndSelection(in_RDI);
  (**(code **)(*(long *)in_RDI + 0x60))();
  QWidgetTextControlPrivate::repaintOldAndNewSelection(this_00,in_RSI);
  if ((uVar4 & 0x1000000) != 0) {
    cursorPositionChanged((QWidgetTextControl *)0x712ed2);
  }
  if ((in_DL & 1) != 0) {
    QWidgetTextControlPrivate::setClipboardSelection
              ((QWidgetTextControlPrivate *)CONCAT44(uVar4,in_stack_ffffffffffffffc0.i));
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::setTextCursor(const QTextCursor &cursor, bool selectionClipboard)
{
    Q_D(QWidgetTextControl);
    d->cursorIsFocusIndicator = false;
    const bool posChanged = cursor.position() != d->cursor.position();
    const QTextCursor oldSelection = d->cursor;
    d->cursor = cursor;
    d->cursorOn = d->hasFocus
            && (d->interactionFlags & (Qt::TextSelectableByKeyboard | Qt::TextEditable));
    d->_q_updateCurrentCharFormatAndSelection();
    ensureCursorVisible();
    d->repaintOldAndNewSelection(oldSelection);
    if (posChanged)
        emit cursorPositionChanged();

#ifndef QT_NO_CLIPBOARD
    if (selectionClipboard)
        d->setClipboardSelection();
#else
    Q_UNUSED(selectionClipboard);
#endif
}